

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int copy_out(archive_write *a,uint64_t offset,uint64_t length)

{
  long *plVar1;
  ulong uVar2;
  void *pvVar3;
  int iVar4;
  __off_t _Var5;
  ssize_t sVar6;
  int *piVar7;
  ulong __nbytes;
  char *fmt;
  
  piVar7 = (int *)a->format_data;
  iVar4 = 0;
  _Var5 = lseek(*piVar7,offset,0);
  if (_Var5 < 0) {
    piVar7 = __errno_location();
    iVar4 = *piVar7;
    fmt = "lseek failed";
LAB_0017c246:
    archive_set_error(&a->archive,iVar4,fmt);
LAB_0017c24d:
    iVar4 = -0x1e;
  }
  else if (length != 0) {
    do {
      uVar2 = *(ulong *)(piVar7 + 0x4048);
      __nbytes = uVar2;
      if (length < uVar2) {
        __nbytes = length;
      }
      sVar6 = read(*piVar7,(void *)((long)piVar7 + (0x10120 - uVar2)),__nbytes);
      if (sVar6 < 0) {
        piVar7 = __errno_location();
        archive_set_error(&a->archive,*piVar7,"Can\'t read temporary file(%jd)",sVar6);
        goto LAB_0017c24d;
      }
      if (sVar6 == 0) {
        fmt = "Truncated xar archive";
        iVar4 = 0;
        goto LAB_0017c246;
      }
      plVar1 = (long *)(piVar7 + 0x4048);
      *plVar1 = *plVar1 - sVar6;
      if (*plVar1 == 0) {
        pvVar3 = a->format_data;
        iVar4 = __archive_write_output
                          (a,(void *)((long)pvVar3 + 0x120),
                           0x10000 - *(long *)((long)pvVar3 + 0x10120));
        if (iVar4 != 0) {
          return iVar4;
        }
        *(undefined8 *)((long)pvVar3 + 0x10120) = 0x10000;
      }
      length = length - sVar6;
    } while (length != 0);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
copy_out(struct archive_write *a, uint64_t offset, uint64_t length)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)a->format_data;
	if (lseek(xar->temp_fd, offset, SEEK_SET) < 0) {
		archive_set_error(&(a->archive), errno, "lseek failed");
		return (ARCHIVE_FATAL);
	}
	while (length) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		if (length > xar->wbuff_remaining)
			rsize = xar->wbuff_remaining;
		else
			rsize = (size_t)length;
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		rs = read(xar->temp_fd, wb, rsize);
		if (rs < 0) {
			archive_set_error(&(a->archive), errno,
			    "Can't read temporary file(%jd)",
			    (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		if (rs == 0) {
			archive_set_error(&(a->archive), 0,
			    "Truncated xar archive");
			return (ARCHIVE_FATAL);
		}
		xar->wbuff_remaining -= rs;
		length -= rs;
		if (xar->wbuff_remaining == 0) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
	}
	return (ARCHIVE_OK);
}